

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkCheck(Parse *pParse,Table *pTab,int regOld,int regNew)

{
  u8 uVar1;
  int iVar2;
  Index *pIVar3;
  int iVar4;
  Table *pTVar5;
  Vdbe *p;
  FKey *pFVar6;
  SrcList *pSrc;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  Schema **ppSVar7;
  ulong uVar8;
  uint uVar9;
  sColMap *psVar10;
  sqlite3 *db;
  int iVar11;
  long lVar12;
  int *aiCol;
  char *zDbase;
  int *aiFree;
  Index *pIdx;
  Table *local_70;
  Parse *local_68;
  sqlite3 *local_60;
  int local_58;
  int iCol;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_50 = CONCAT44(in_register_00000014,regOld);
  local_40 = CONCAT44(in_register_0000000c,regNew);
  db = pParse->db;
  if ((db->flags & 0x40000) != 0) {
    if (pTab->pSchema == (Schema *)0x0) {
      uVar8 = 0xfff0bdc0;
    }
    else {
      uVar9 = db->nDb;
      if ((int)uVar9 < 1) {
        uVar8 = 0;
      }
      else {
        ppSVar7 = &db->aDb->pSchema;
        uVar8 = 0;
        do {
          if (*ppSVar7 == pTab->pSchema) goto LAB_0016ddb5;
          uVar8 = uVar8 + 1;
          ppSVar7 = ppSVar7 + 4;
        } while (uVar9 != uVar8);
        uVar8 = (ulong)uVar9;
      }
    }
LAB_0016ddb5:
    uVar1 = pParse->disableTriggers;
    pFVar6 = pTab->pFKey;
    local_70 = pTab;
    local_68 = pParse;
    if (pFVar6 != (FKey *)0x0) {
      zDbase = db->aDb[(int)uVar8].zName;
      iVar11 = regOld + 1;
      local_60 = db;
      local_58 = iVar11;
      local_48 = zDbase;
      local_38 = uVar8;
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (pParse->disableTriggers == '\0') {
          pTVar5 = sqlite3LocateTable(pParse,0,pFVar6->zTo,zDbase);
        }
        else {
          pTVar5 = sqlite3FindTable(db,pFVar6->zTo,zDbase);
        }
        if ((pTVar5 == (Table *)0x0) ||
           (iVar4 = sqlite3FkLocateIndex(pParse,pTVar5,pFVar6,&pIdx,&aiFree), pIVar3 = pIdx,
           iVar4 != 0)) {
          if (uVar1 == '\0') {
            return;
          }
          if (db->mallocFailed != '\0') {
            return;
          }
          if (pTVar5 == (Table *)0x0) {
            p = sqlite3GetVdbe(pParse);
            iVar4 = pFVar6->nCol;
            if (0 < iVar4) {
              iVar2 = p->nOp;
              psVar10 = pFVar6->aCol;
              lVar12 = 0;
              do {
                sqlite3VdbeAddOp3(p,0x49,psVar10->iFrom + iVar11,iVar2 + iVar4 + 1,0);
                lVar12 = lVar12 + 1;
                psVar10 = psVar10 + 1;
              } while (lVar12 < pFVar6->nCol);
            }
            sqlite3VdbeAddOp3(p,0x75,(uint)pFVar6->isDeferred,-1,0);
            pParse = local_68;
            db = local_60;
            zDbase = local_48;
          }
        }
        else {
          aiCol = aiFree;
          if (aiFree == (int *)0x0) {
            iCol = pFVar6->aCol[0].iFrom;
            aiCol = &iCol;
          }
          if (pFVar6->nCol < 1) {
            uVar9 = 0;
          }
          else {
            lVar12 = 0;
            uVar9 = 0;
            do {
              if (aiCol[lVar12] == (int)local_70->iPKey) {
                aiCol[lVar12] = -1;
              }
              if (local_60->xAuth !=
                  (_func_int_void_ptr_int_char_ptr_char_ptr_char_ptr_char_ptr *)0x0) {
                if (pIVar3 == (Index *)0x0) {
                  iVar11 = (int)pTVar5->iPKey;
                }
                else {
                  iVar11 = pIVar3->aiColumn[lVar12];
                }
                iVar11 = sqlite3AuthReadCol(local_68,pTVar5->zName,pTVar5->aCol[iVar11].zName,
                                            (int)local_38);
                uVar9 = (uint)(iVar11 == 2);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < pFVar6->nCol);
          }
          pParse = local_68;
          iVar11 = (int)local_38;
          sqlite3TableLock(local_68,iVar11,pTVar5->tnum,'\0',pTVar5->zName);
          pParse->nTab = pParse->nTab + 1;
          if ((int)local_50 != 0) {
            fkLookupParent(pParse,iVar11,pTVar5,pIdx,pFVar6,aiCol,(int)local_50,-1,uVar9);
          }
          if ((int)local_40 != 0) {
            fkLookupParent(pParse,iVar11,pTVar5,pIdx,pFVar6,aiCol,(int)local_40,1,uVar9);
          }
          db = local_60;
          sqlite3DbFree(local_60,aiFree);
          zDbase = local_48;
          iVar11 = local_58;
        }
        pFVar6 = pFVar6->pNextFrom;
      } while (pFVar6 != (FKey *)0x0);
    }
    pFVar6 = sqlite3FkReferences(local_70);
    if (pFVar6 != (FKey *)0x0) {
      do {
        pIdx = (Index *)0x0;
        aiFree = (int *)0x0;
        if (((pFVar6->isDeferred != '\0') || (pParse->pToplevel != (Parse *)0x0)) ||
           (pParse->isMultiWrite != '\0')) {
          iVar11 = sqlite3FkLocateIndex(pParse,local_70,pFVar6,&pIdx,&aiFree);
          if (iVar11 == 0) {
            pSrc = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
            if (pSrc != (SrcList *)0x0) {
              pTVar5 = pFVar6->pFrom;
              pSrc->a[0].pTab = pTVar5;
              pSrc->a[0].zName = pTVar5->zName;
              pTVar5->nRef = pTVar5->nRef + 1;
              iVar11 = local_68->nTab;
              local_68->nTab = iVar11 + 1;
              pSrc->a[0].iCursor = iVar11;
              if ((int)local_40 != 0) {
                fkScanChildren(local_68,pSrc,local_70,pIdx,pFVar6,aiFree,(int)local_40,-1);
              }
              if ((int)local_50 != 0) {
                fkScanChildren(local_68,pSrc,local_70,pIdx,pFVar6,aiFree,(int)local_50,1);
              }
              pSrc->a[0].zName = (char *)0x0;
              sqlite3SrcListDelete(db,pSrc);
            }
            sqlite3DbFree(db,aiFree);
            pParse = local_68;
          }
          else {
            if (uVar1 == '\0') {
              return;
            }
            if (db->mallocFailed != '\0') {
              return;
            }
          }
        }
        pFVar6 = pFVar6->pNextTo;
      } while (pFVar6 != (FKey *)0x0);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkCheck(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Row is being deleted from this table */ 
  int regOld,                     /* Previous row data is stored here */
  int regNew                      /* New row data is stored here */
){
  sqlite3 *db = pParse->db;       /* Database handle */
  FKey *pFKey;                    /* Used to iterate through FKs */
  int iDb;                        /* Index of database containing pTab */
  const char *zDb;                /* Name of database containing pTab */
  int isIgnoreErrors = pParse->disableTriggers;

  /* Exactly one of regOld and regNew should be non-zero. */
  assert( (regOld==0)!=(regNew==0) );

  /* If foreign-keys are disabled, this function is a no-op. */
  if( (db->flags&SQLITE_ForeignKeys)==0 ) return;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  zDb = db->aDb[iDb].zName;

  /* Loop through all the foreign key constraints for which pTab is the
  ** child table (the table that the foreign key definition is part of).  */
  for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
    Table *pTo;                   /* Parent table of foreign key pFKey */
    Index *pIdx = 0;              /* Index on key columns in pTo */
    int *aiFree = 0;
    int *aiCol;
    int iCol;
    int i;
    int isIgnore = 0;

    /* Find the parent table of this foreign key. Also find a unique index 
    ** on the parent key columns in the parent table. If either of these 
    ** schema items cannot be located, set an error in pParse and return 
    ** early.  */
    if( pParse->disableTriggers ){
      pTo = sqlite3FindTable(db, pFKey->zTo, zDb);
    }else{
      pTo = sqlite3LocateTable(pParse, 0, pFKey->zTo, zDb);
    }
    if( !pTo || sqlite3FkLocateIndex(pParse, pTo, pFKey, &pIdx, &aiFree) ){
      assert( isIgnoreErrors==0 || (regOld!=0 && regNew==0) );
      if( !isIgnoreErrors || db->mallocFailed ) return;
      if( pTo==0 ){
        /* If isIgnoreErrors is true, then a table is being dropped. In this
        ** case SQLite runs a "DELETE FROM xxx" on the table being dropped
        ** before actually dropping it in order to check FK constraints.
        ** If the parent table of an FK constraint on the current table is
        ** missing, behave as if it is empty. i.e. decrement the relevant
        ** FK counter for each row of the current table with non-NULL keys.
        */
        Vdbe *v = sqlite3GetVdbe(pParse);
        int iJump = sqlite3VdbeCurrentAddr(v) + pFKey->nCol + 1;
        for(i=0; i<pFKey->nCol; i++){
          int iReg = pFKey->aCol[i].iFrom + regOld + 1;
          sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iJump);
        }
        sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, -1);
      }
      continue;
    }
    assert( pFKey->nCol==1 || (aiFree && pIdx) );

    if( aiFree ){
      aiCol = aiFree;
    }else{
      iCol = pFKey->aCol[0].iFrom;
      aiCol = &iCol;
    }
    for(i=0; i<pFKey->nCol; i++){
      if( aiCol[i]==pTab->iPKey ){
        aiCol[i] = -1;
      }
#ifndef SQLITE_OMIT_AUTHORIZATION
      /* Request permission to read the parent key columns. If the 
      ** authorization callback returns SQLITE_IGNORE, behave as if any
      ** values read from the parent table are NULL. */
      if( db->xAuth ){
        int rcauth;
        char *zCol = pTo->aCol[pIdx ? pIdx->aiColumn[i] : pTo->iPKey].zName;
        rcauth = sqlite3AuthReadCol(pParse, pTo->zName, zCol, iDb);
        isIgnore = (rcauth==SQLITE_IGNORE);
      }
#endif
    }

    /* Take a shared-cache advisory read-lock on the parent table. Allocate 
    ** a cursor to use to search the unique index on the parent key columns 
    ** in the parent table.  */
    sqlite3TableLock(pParse, iDb, pTo->tnum, 0, pTo->zName);
    pParse->nTab++;

    if( regOld!=0 ){
      /* A row is being removed from the child table. Search for the parent.
      ** If the parent does not exist, removing the child row resolves an 
      ** outstanding foreign key constraint violation. */
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regOld, -1,isIgnore);
    }
    if( regNew!=0 ){
      /* A row is being added to the child table. If a parent row cannot
      ** be found, adding the child row has violated the FK constraint. */ 
      fkLookupParent(pParse, iDb, pTo, pIdx, pFKey, aiCol, regNew, +1,isIgnore);
    }

    sqlite3DbFree(db, aiFree);
  }

  /* Loop through all the foreign key constraints that refer to this table */
  for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
    Index *pIdx = 0;              /* Foreign key index for pFKey */
    SrcList *pSrc;
    int *aiCol = 0;

    if( !pFKey->isDeferred && !pParse->pToplevel && !pParse->isMultiWrite ){
      assert( regOld==0 && regNew!=0 );
      /* Inserting a single row into a parent table cannot cause an immediate
      ** foreign key violation. So do nothing in this case.  */
      continue;
    }

    if( sqlite3FkLocateIndex(pParse, pTab, pFKey, &pIdx, &aiCol) ){
      if( !isIgnoreErrors || db->mallocFailed ) return;
      continue;
    }
    assert( aiCol || pFKey->nCol==1 );

    /* Create a SrcList structure containing a single table (the table 
    ** the foreign key that refers to this table is attached to). This
    ** is required for the sqlite3WhereXXX() interface.  */
    pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
    if( pSrc ){
      struct SrcList_item *pItem = pSrc->a;
      pItem->pTab = pFKey->pFrom;
      pItem->zName = pFKey->pFrom->zName;
      pItem->pTab->nRef++;
      pItem->iCursor = pParse->nTab++;
  
      if( regNew!=0 ){
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regNew, -1);
      }
      if( regOld!=0 ){
        /* If there is a RESTRICT action configured for the current operation
        ** on the parent table of this FK, then throw an exception 
        ** immediately if the FK constraint is violated, even if this is a
        ** deferred trigger. That's what RESTRICT means. To defer checking
        ** the constraint, the FK should specify NO ACTION (represented
        ** using OE_None). NO ACTION is the default.  */
        fkScanChildren(pParse, pSrc, pTab, pIdx, pFKey, aiCol, regOld, 1);
      }
      pItem->zName = 0;
      sqlite3SrcListDelete(db, pSrc);
    }
    sqlite3DbFree(db, aiCol);
  }
}